

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O1

void __thiscall Block<float>::generate_values(Block<float> *this,size_t n,float min_,float max_)

{
  float fVar1;
  float fVar2;
  int iVar3;
  size_t sVar4;
  
  this->min = min_;
  this->max = max_;
  std::vector<float,_std::allocator<float>_>::resize(&this->values,n);
  if (n != 0) {
    sVar4 = 0;
    do {
      fVar1 = this->min;
      fVar2 = this->max;
      iVar3 = rand();
      (this->values).super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start[sVar4] =
           (fVar2 - fVar1) * (float)(iVar3 % 0x400) * 0.0009765625 + fVar1;
      sVar4 = sVar4 + 1;
    } while (n != sVar4);
  }
  return;
}

Assistant:

void            generate_values(size_t n, T min_, T max_)
  {
    min = min_;
    max = max_;

    values.resize(n);
    for (size_t i = 0; i < n; ++i)
      values[i] = random<Value>(min, max);
  }